

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.h
# Opt level: O2

void __thiscall
slang::ast::ReplicatedAssignmentPatternExpression::visitExprs<Visitor&>
          (ReplicatedAssignmentPatternExpression *this,Result *visitor)

{
  Expression::visit<Visitor&>(this->count_,visitor);
  AssignmentPatternExpressionBase::visitExprs<Visitor&>
            (&this->super_AssignmentPatternExpressionBase,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        count().visit(visitor);
        AssignmentPatternExpressionBase::visitExprs(visitor);
    }